

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O1

void ggml::cpu::aarch64::gemv<block_q4_0,8l,4l,(ggml_type)8>
               (int n,float *s,size_t bs,void *vx,void *vy,int nr,int nc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  float *pfVar5;
  int iVar6;
  ulong *puVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float sumf [4];
  
  if (3 < nc) {
    iVar6 = n + 0x1f;
    if (-1 < n) {
      iVar6 = n;
    }
    puVar7 = (ulong *)((long)vx + 8);
    uVar8 = 0;
    auVar9[8] = 0xf0;
    auVar9._0_8_ = 0xf0f0f0f0f0f0f0f0;
    auVar9[9] = 0xf0;
    auVar9[10] = 0xf0;
    auVar9[0xb] = 0xf0;
    auVar9[0xc] = 0xf0;
    auVar9[0xd] = 0xf0;
    auVar9[0xe] = 0xf0;
    auVar9[0xf] = 0xf0;
    do {
      if (0x1f < n) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = *(ulong *)((long)vy + 0x12);
        auVar3 = vpmovsxbd_avx2(auVar1);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = *(ulong *)((long)vy + 2);
        vpmovsxbd_avx2(auVar2);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = *puVar7;
        auVar9 = vpand_avx(auVar10,auVar9);
        auVar4 = vpmovsxbd_avx2(auVar9);
        vpmulld_avx2(auVar3,auVar4);
        halt_baddata();
      }
      pfVar5 = s + uVar8 * 4;
      pfVar5[0] = 0.0;
      pfVar5[1] = 0.0;
      pfVar5[2] = 0.0;
      pfVar5[3] = 0.0;
      uVar8 = uVar8 + 1;
      puVar7 = puVar7 + (long)(iVar6 >> 5) * 9;
    } while (uVar8 != (uint)nc >> 2);
  }
  return;
}

Assistant:

void gemv<block_q4_0, 8, 4, GGML_TYPE_Q8_0>(int n, float * s, size_t bs, const void * vx, const void * vy, int nr, int nc) {
    ggml_gemv_q4_0_4x8_q8_0(n, s, bs, vx, vy, nr, nc);
}